

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem_p.h
# Opt level: O1

void __thiscall QGraphicsItemPrivate::ensureSortedChildren(QGraphicsItemPrivate *this)

{
  qreal *pqVar1;
  QGraphicsItem **ppQVar2;
  long lVar3;
  double dVar4;
  QGraphicsItem *pQVar5;
  QGraphicsItemPrivate *pQVar6;
  QGraphicsItemPrivate *pQVar7;
  iterator __first;
  iterator __last;
  ulong uVar8;
  QGraphicsItem **ppQVar9;
  iterator iVar10;
  QGraphicsItem **ppQVar11;
  value_type __val_2;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  iterator iVar15;
  long lVar16;
  size_t __n;
  iterator __i;
  QGraphicsItem **ppQVar17;
  value_type __val;
  bool bVar18;
  
  if (((uint)*(ulong *)&this->field_0x160 >> 0x1d & 1) != 0) {
    *(ulong *)&this->field_0x160 = *(ulong *)&this->field_0x160 & 0xffffffffdfffffff;
    this->field_0x168 = this->field_0x168 | 0x20;
    if ((this->children).d.size != 0) {
      __first = QList<QGraphicsItem_*>::begin(&this->children);
      __last = QList<QGraphicsItem_*>::end(&this->children);
      if (__first.i != __last.i) {
        uVar8 = (long)__last.i - (long)__first.i >> 3;
        lVar16 = 0x3f;
        if (uVar8 != 0) {
          for (; uVar8 >> lVar16 == 0; lVar16 = lVar16 + -1) {
          }
        }
        std::
        __introsort_loop<QList<QGraphicsItem*>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                  (__first,__last,(ulong)(((uint)lVar16 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)0x5fb098
                  );
        ppQVar17 = __first.i + 1;
        iVar10 = __first;
        if ((long)__last.i - (long)__first.i < 0x81) {
          for (; ppQVar17 != __last.i; ppQVar17 = ppQVar17 + 1) {
            pQVar5 = *ppQVar17;
            pQVar6 = ((*__first.i)->d_ptr).d;
            pQVar7 = (pQVar5->d_ptr).d;
            uVar8 = *(ulong *)&pQVar7->field_0x160 & 0x10000000000;
            uVar13 = (uint)(uVar8 >> 0x28);
            if (((uint)((ulong)*(undefined8 *)&pQVar6->field_0x160 >> 0x28) & 1) == uVar13) {
              dVar4 = pQVar6->z;
              pqVar1 = &pQVar7->z;
              if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                bVar18 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
              }
              else {
                bVar18 = pQVar7->siblingIndex < pQVar6->siblingIndex;
              }
            }
            else {
              bVar18 = uVar8 != 0;
            }
            if (bVar18) {
              lVar16 = (long)ppQVar17 - (long)__first.i >> 3;
              iVar15 = __first;
              if (0 < lVar16) {
                lVar14 = 1;
                do {
                  iVar10.i[lVar14] = iVar10.i[lVar14 + -1];
                  lVar3 = lVar16 + lVar14;
                  lVar14 = lVar14 + -1;
                } while (1 < lVar3 + -1);
              }
            }
            else {
              pQVar6 = ((*iVar10.i)->d_ptr).d;
              if (((uint)((ulong)*(undefined8 *)&pQVar6->field_0x160 >> 0x28) & 1) == uVar13) {
                dVar4 = pQVar6->z;
                pqVar1 = &pQVar7->z;
                if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                  bVar18 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
                }
                else {
                  bVar18 = pQVar7->siblingIndex < pQVar6->siblingIndex;
                }
              }
              else {
                bVar18 = uVar8 != 0;
              }
              iVar15.i = ppQVar17;
              ppQVar11 = ppQVar17;
              if (bVar18) {
                do {
                  *ppQVar11 = ppQVar11[-1];
                  pQVar6 = (ppQVar11[-2]->d_ptr).d;
                  pQVar7 = (pQVar5->d_ptr).d;
                  uVar8 = *(ulong *)&pQVar7->field_0x160 & 0x10000000000;
                  if (((uint)((ulong)*(undefined8 *)&pQVar6->field_0x160 >> 0x28) & 1) ==
                      (uint)(uVar8 >> 0x28)) {
                    dVar4 = pQVar6->z;
                    pqVar1 = &pQVar7->z;
                    if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                      bVar18 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
                    }
                    else {
                      bVar18 = pQVar7->siblingIndex < pQVar6->siblingIndex;
                    }
                  }
                  else {
                    bVar18 = uVar8 != 0;
                  }
                  iVar15.i = ppQVar11 + -1;
                  ppQVar11 = ppQVar11 + -1;
                } while (bVar18);
              }
            }
            *iVar15.i = pQVar5;
            iVar10.i = iVar10.i + 1;
          }
        }
        else {
          __n = 8;
          ppQVar11 = ppQVar17;
          do {
            pQVar5 = *(QGraphicsItem **)((long)__first.i + __n);
            pQVar6 = ((*__first.i)->d_ptr).d;
            pQVar7 = (pQVar5->d_ptr).d;
            uVar8 = *(ulong *)&pQVar7->field_0x160 & 0x10000000000;
            uVar13 = (uint)(uVar8 >> 0x28);
            if (((uint)((ulong)*(undefined8 *)&pQVar6->field_0x160 >> 0x28) & 1) == uVar13) {
              dVar4 = pQVar6->z;
              pqVar1 = &pQVar7->z;
              if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                bVar18 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
              }
              else {
                bVar18 = pQVar7->siblingIndex < pQVar6->siblingIndex;
              }
            }
            else {
              bVar18 = uVar8 != 0;
            }
            ppQVar2 = __first.i + __n;
            if (bVar18) {
              memmove(ppQVar17,__first.i,__n);
              iVar10 = __first;
            }
            else {
              pQVar6 = ((*iVar10.i)->d_ptr).d;
              if (((uint)((ulong)*(undefined8 *)&pQVar6->field_0x160 >> 0x28) & 1) == uVar13) {
                dVar4 = pQVar6->z;
                pqVar1 = &pQVar7->z;
                if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                  bVar18 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
                }
                else {
                  bVar18 = pQVar7->siblingIndex < pQVar6->siblingIndex;
                }
              }
              else {
                bVar18 = uVar8 != 0;
              }
              iVar10.i = ppQVar2;
              ppQVar9 = ppQVar11;
              if (bVar18) {
                do {
                  *ppQVar9 = ppQVar9[-1];
                  pQVar6 = (ppQVar9[-2]->d_ptr).d;
                  pQVar7 = (pQVar5->d_ptr).d;
                  uVar8 = *(ulong *)&pQVar7->field_0x160 & 0x10000000000;
                  if (((uint)((ulong)*(undefined8 *)&pQVar6->field_0x160 >> 0x28) & 1) ==
                      (uint)(uVar8 >> 0x28)) {
                    dVar4 = pQVar6->z;
                    pqVar1 = &pQVar7->z;
                    if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                      bVar18 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
                    }
                    else {
                      bVar18 = pQVar7->siblingIndex < pQVar6->siblingIndex;
                    }
                  }
                  else {
                    bVar18 = uVar8 != 0;
                  }
                  iVar10.i = ppQVar9 + -1;
                  ppQVar9 = iVar10.i;
                } while (bVar18);
              }
            }
            *iVar10.i = pQVar5;
            __n = __n + 8;
            ppQVar11 = ppQVar11 + 1;
            iVar10.i = ppQVar2;
          } while (__n != 0x80);
          for (ppQVar17 = __first.i + 0x10; ppQVar17 != __last.i; ppQVar17 = ppQVar17 + 1) {
            pQVar5 = *ppQVar17;
            pQVar6 = (ppQVar17[-1]->d_ptr).d;
            pQVar7 = (pQVar5->d_ptr).d;
            uVar8 = *(ulong *)&pQVar7->field_0x160 & 0x10000000000;
            if (((uint)((ulong)*(undefined8 *)&pQVar6->field_0x160 >> 0x28) & 1) ==
                (uint)(uVar8 >> 0x28)) {
              dVar4 = pQVar6->z;
              pqVar1 = &pQVar7->z;
              if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                bVar18 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
              }
              else {
                bVar18 = pQVar7->siblingIndex < pQVar6->siblingIndex;
              }
            }
            else {
              bVar18 = uVar8 != 0;
            }
            ppQVar11 = ppQVar17;
            if (bVar18) {
              do {
                *ppQVar11 = ppQVar11[-1];
                pQVar6 = (ppQVar11[-2]->d_ptr).d;
                pQVar7 = (pQVar5->d_ptr).d;
                uVar8 = *(ulong *)&pQVar7->field_0x160 & 0x10000000000;
                if (((uint)((ulong)*(undefined8 *)&pQVar6->field_0x160 >> 0x28) & 1) ==
                    (uint)(uVar8 >> 0x28)) {
                  dVar4 = pQVar6->z;
                  pqVar1 = &pQVar7->z;
                  if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                    bVar18 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
                  }
                  else {
                    bVar18 = pQVar7->siblingIndex < pQVar6->siblingIndex;
                  }
                }
                else {
                  bVar18 = uVar8 != 0;
                }
                ppQVar11 = ppQVar11 + -1;
              } while (bVar18);
            }
            *ppQVar11 = pQVar5;
          }
        }
      }
      uVar8 = (this->children).d.size;
      if (uVar8 != 0) {
        uVar12 = 0;
        do {
          if (uVar12 != (uint)(((this->children).d.ptr[uVar12]->d_ptr).d)->siblingIndex) {
            this->field_0x168 = this->field_0x168 & 0xdf;
            return;
          }
          uVar12 = uVar12 + 1;
        } while (uVar8 != uVar12);
      }
    }
  }
  return;
}

Assistant:

inline void QGraphicsItemPrivate::ensureSortedChildren()
{
    if (needSortChildren) {
        needSortChildren = 0;
        sequentialOrdering = 1;
        if (children.isEmpty())
            return;
        std::sort(children.begin(), children.end(), qt_notclosestLeaf);
        for (int i = 0; i < children.size(); ++i) {
            if (children.at(i)->d_ptr->siblingIndex != i) {
                sequentialOrdering = 0;
                break;
            }
        }
    }
}